

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_length(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  operand local_148;
  operation local_144 [2];
  operand local_13c [2];
  operation local_134;
  operand local_130 [2];
  operation local_128 [3];
  operand local_11c [2];
  operation local_114 [2];
  operand local_10c [2];
  operation local_104;
  operand local_100;
  operation local_fc;
  unsigned_long local_f8;
  operand local_ec [2];
  operation local_e4 [3];
  operand local_d8 [2];
  operation local_d0 [2];
  operand local_c8 [2];
  operation local_c0 [3];
  operand local_b4 [2];
  operation local_ac;
  string local_a8;
  undefined1 local_88 [8];
  string error;
  undefined1 local_58 [8];
  string lab_finish;
  string lab_start;
  compiler_options *ops_local;
  asmcode *code_local;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&lab_finish.field_2 + 8),psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab);
  std::__cxx11::string::string((string *)local_88);
  psVar1 = label;
  if ((ops->safe_primitives & 1U) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_a8,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_ac = CMP;
    local_b4[1] = 0x14;
    local_b4[0] = NUMBER;
    local_c0[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_ac,local_b4 + 1,local_b4,(int *)(local_c0 + 2));
    local_c0[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_c0 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  }
  local_c0[0] = XOR;
  local_c8[1] = 0x18;
  local_c8[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_c0,local_c8 + 1,local_c8);
  local_d0[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_d0 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&lab_finish.field_2 + 8));
  local_d0[0] = CMP;
  local_d8[1] = 0xb;
  local_d8[0] = NUMBER;
  local_e4[2] = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_d0,local_d8 + 1,local_d8,(int *)(local_e4 + 2));
  local_e4[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_e4 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_is_not_block(code,RCX,R11,(string *)local_88);
  }
  local_e4[0] = AND;
  local_ec[1] = 0xb;
  local_ec[0] = NUMBER;
  local_f8 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_e4,local_ec + 1,local_ec,&local_f8);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_does_not_point_to_pair(code,RCX,R11,(string *)local_88);
  }
  local_fc = INC;
  local_100 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_fc,&local_100);
  local_104 = MOV;
  local_10c[1] = 9;
  local_10c[0] = MEM_RCX;
  local_114[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_104,local_10c + 1,local_10c,(int *)(local_114 + 1));
  local_114[0] = MOV;
  local_11c[1] = 0xb;
  local_11c[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_114,local_11c + 1,local_11c);
  local_128[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_128 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&lab_finish.field_2 + 8));
  local_128[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_128 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_128[0] = MOV;
  local_130[1] = 9;
  local_130[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_128,local_130 + 1,local_130);
  local_134 = SHL;
  local_13c[1] = 9;
  local_13c[0] = NUMBER;
  local_144[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_134,local_13c + 1,local_13c,(int *)(local_144 + 1));
  local_144[0] = JMP;
  local_148 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_144,&local_148);
  if ((ops->safe_primitives & 1U) != 0) {
    error_label(code,(string *)local_88,re_length_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(lab_finish.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_length(asmcode& code, const compiler_options& ops)
  {
  auto lab_start = label_to_string(label++);
  auto lab_finish = label_to_string(label++);
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::XOR, asmcode::R15, asmcode::R15);
  code.add(asmcode::LABEL, lab_start);
  code.add(asmcode::CMP, asmcode::RCX, asmcode::NUMBER, nil);
  code.add(asmcode::JES, lab_finish);
  if (ops.safe_primitives)
    {
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_pair(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX, CELLS(2));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::RAX);
  code.add(asmcode::JMPS, lab_start);
  code.add(asmcode::LABEL, lab_finish);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_length_contract_violation);
    }
  }